

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

bool console::readline(string *line,bool multiline_input)

{
  ulong uVar1;
  size_type sVar2;
  char *pcVar3;
  char cVar4;
  wchar_t __c;
  wint_t wVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  istream *piVar9;
  long lVar10;
  undefined8 uVar11;
  ulong uVar12;
  char cVar13;
  pointer __ptr;
  ulong uVar14;
  size_t __size;
  vector<int,_std::allocator<int>_> widths;
  int x2;
  int x1;
  int y2;
  int y1;
  int *local_68;
  iterator iStack_60;
  int *local_58;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined1 local_40 [4];
  undefined1 local_3c [4];
  undefined1 local_38 [2];
  ushort local_36;
  
  set_display(user_input);
  cVar13 = (char)line;
  if (simple_io != '\x01') {
    if (out != _stdout) {
      fflush(_stdout);
    }
    line->_M_string_length = 0;
    *(line->_M_dataplus)._M_p = '\0';
    local_58 = (int *)0x0;
    local_68 = (int *)0x0;
    iStack_60._M_current = (int *)0x0;
    uVar14 = 0;
    do {
      fflush(out);
      __c = getwchar();
      if (((uint)(__c + L'\x01') < 0xf) && ((0x4821U >> (__c + L'\x01' & 0x1fU) & 1) != 0)) {
        if ((uVar14 & 1) == 0) {
          if ((__c == L'\r') || (__c == L'\n')) {
            std::__cxx11::string::push_back(cVar13);
            fputc(10,out);
            goto LAB_00225e90;
          }
        }
        else {
          fprintf(out,"\b%c",0x20);
          putc(8,out);
          cVar4 = (line->_M_dataplus)._M_p[line->_M_string_length - 1];
          std::__cxx11::string::pop_back();
          if (cVar4 == '\\') {
            std::__cxx11::string::push_back(cVar13);
            fputc(10,out);
            multiline_input = !multiline_input;
            goto LAB_00225e90;
          }
          if ((line->_M_string_length == 1) && (pcVar3 = (line->_M_dataplus)._M_p, *pcVar3 == ' '))
          {
            line->_M_string_length = 0;
            *pcVar3 = '\0';
            putc(8,out);
          }
        }
        multiline_input = false;
LAB_00225e90:
        fflush(out);
        if (local_68 == (int *)0x0) {
          return multiline_input;
        }
        operator_delete(local_68,(long)local_58 - (long)local_68);
        return multiline_input;
      }
      if ((uVar14 & 1) != 0) {
        set_display(user_input);
        uVar14 = 0;
        fprintf(out,"\b%c",(ulong)(uint)(int)(line->_M_dataplus)._M_p[line->_M_string_length - 1]);
      }
      if ((__c == L'\b') || (__c == L'\x7f')) {
        do {
          if (local_68 == iStack_60._M_current) break;
          iVar6 = iStack_60._M_current[-1];
          iStack_60._M_current = iStack_60._M_current + -1;
          iVar7 = iVar6;
          if (0 < iVar6) {
            do {
              fprintf(out,"\b%c",0x20);
              putc(8,out);
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
          uVar1 = line->_M_string_length;
          if (uVar1 != 0) {
            uVar12 = uVar1 - 1;
            if (uVar1 < uVar12) {
              uVar11 = std::__throw_out_of_range_fmt
                                 ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                  "basic_string::erase");
              if (local_68 != (int *)0x0) {
                operator_delete(local_68,(long)local_58 - (long)local_68);
              }
              _Unwind_Resume(uVar11);
            }
            line->_M_string_length = uVar12;
            (line->_M_dataplus)._M_p[uVar12] = '\0';
          }
        } while (iVar6 == 0);
      }
      else if (__c == L'\x1b') {
        wVar5 = getwchar();
        if ((wVar5 & 0xffffffbf) == 0x1b) {
          do {
            wVar5 = getwchar();
            if (((wVar5 == 0xffffffff) || (wVar5 - 0x41 < 0x1a)) || (wVar5 == 0x7e)) break;
          } while (0x19 < wVar5 - 0x61);
        }
      }
      else {
        sVar2 = line->_M_string_length;
        if ((uint)__c < 0x80) {
LAB_00225c04:
          std::__cxx11::string::push_back(cVar13);
        }
        else {
          if ((uint)__c < 0x800) {
            std::__cxx11::string::push_back(cVar13);
            goto LAB_00225c04;
          }
          if ((uint)__c < 0x10000) {
            std::__cxx11::string::push_back(cVar13);
            std::__cxx11::string::push_back(cVar13);
            goto LAB_00225c04;
          }
          if ((uint)__c < 0x110000) {
            std::__cxx11::string::push_back(cVar13);
            std::__cxx11::string::push_back(cVar13);
            std::__cxx11::string::push_back(cVar13);
            goto LAB_00225c04;
          }
        }
        local_50 = (uint)uVar14;
        lVar10 = (long)(int)sVar2;
        __ptr = (line->_M_dataplus)._M_p + lVar10;
        __size = line->_M_string_length - lVar10;
        iVar6 = wcwidth(__c);
        if (tty == (FILE *)0x0 || -1 < iVar6) {
          fwrite(__ptr,__size,1,out);
        }
        else {
          fputs("\x1b[6n",tty);
          iVar7 = __isoc99_fscanf(tty,"\x1b[%d;%dR",local_3c,&local_44);
          fwrite(__ptr,__size,1,tty);
          fputs("\x1b[6n",tty);
          iVar8 = __isoc99_fscanf(tty,"\x1b[%d;%dR",local_40,&local_48);
          if ((iVar8 + iVar7 == 4) && (iVar6 = local_48 - local_44, iVar6 < 0)) {
            ioctl(1,0x5413,local_38);
            iVar6 = iVar6 + (uint)local_36;
          }
        }
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        local_4c = iVar6;
        if (iStack_60._M_current == local_58) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_68,iStack_60,&local_4c);
        }
        else {
          *iStack_60._M_current = iVar6;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        uVar14 = (ulong)local_50;
      }
      if ((line->_M_string_length != 0) &&
         ((cVar4 = (line->_M_dataplus)._M_p[line->_M_string_length - 1], cVar4 == '\\' ||
          (cVar4 == '/')))) {
        set_display(prompt);
        fprintf(out,"\b%c",(ulong)(uint)(int)(line->_M_dataplus)._M_p[line->_M_string_length - 1]);
        uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
      }
    } while( true );
  }
  cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'x');
  piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)&std::cin,(string *)line,cVar4);
  if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0) {
    if (line->_M_string_length != 0) {
      cVar4 = (line->_M_dataplus)._M_p[line->_M_string_length - 1];
      if (cVar4 == '/') {
        std::__cxx11::string::pop_back();
      }
      else if (cVar4 == '\\') {
        std::__cxx11::string::pop_back();
        multiline_input = !multiline_input;
      }
      if (cVar4 == '/') goto LAB_002259b3;
    }
    std::__cxx11::string::push_back(cVar13);
  }
  else {
    line->_M_string_length = 0;
    *(line->_M_dataplus)._M_p = '\0';
LAB_002259b3:
    multiline_input = false;
  }
  return multiline_input;
}

Assistant:

bool readline(std::string & line, bool multiline_input) {
        set_display(user_input);

        if (simple_io) {
            return readline_simple(line, multiline_input);
        }
        return readline_advanced(line, multiline_input);
    }